

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

var __thiscall cs_impl::runtime_cs_ext::await(runtime_cs_ext *this,var *func)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  callable *__x;
  undefined *puVar3;
  object_method *poVar4;
  initializer_list<cs_impl::any> __l;
  allocator_type local_79;
  any local_78;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_70;
  _Any_data local_58;
  code *local_48;
  types local_38;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_30;
  
  if (func->mDat == (proxy *)0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*func->mDat->data->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if ((pcVar1 != "N2cs8callableE") &&
     ((*pcVar1 == '*' || (iVar2 = strcmp(pcVar1,"N2cs8callableE"), iVar2 != 0)))) {
    if (func->mDat == (proxy *)0x0) {
      puVar3 = &void::typeinfo;
    }
    else {
      iVar2 = (*func->mDat->data->_vptr_baseHolder[2])();
      puVar3 = (undefined *)CONCAT44(extraout_var_00,iVar2);
    }
    pcVar1 = *(char **)(puVar3 + 8);
    if ((pcVar1 == "N2cs13object_methodE") ||
       ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N2cs13object_methodE"), iVar2 == 0)))) {
      poVar4 = any::const_val<cs::object_method>(func);
      local_78.mDat = (poVar4->object).mDat;
      if (local_78.mDat != (proxy *)0x0) {
        (local_78.mDat)->refcount = (local_78.mDat)->refcount + 1;
      }
      __l._M_len = 1;
      __l._M_array = &local_78;
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&local_70,__l,&local_79);
      async_callable::async_callable((async_callable *)&local_58,&poVar4->callable,&local_70);
      fiber::await<cs_impl::runtime_cs_ext::async_callable>((async_callable *)this);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_30);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_70);
      any::recycle(&local_78);
    }
    else {
      any::any<cs::pointer>((any *)this,(pointer *)&cs::null_pointer);
    }
    return (var)(proxy *)this;
  }
  __x = any::const_val<cs::callable>(func);
  std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::function
            ((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)> *)
             &local_58,&__x->mFunc);
  local_38 = __x->mType;
  local_30.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_30.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fiber::await<cs_impl::runtime_cs_ext::async_callable>((async_callable *)this);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_30);
  if (local_48 == (code *)0x0) {
    return (var)(proxy *)this;
  }
  (*local_48)(&local_58,&local_58,__destroy_functor);
  return (var)(proxy *)this;
}

Assistant:

var await(const var &func)
		{
			if (func.type() == typeid(callable)) {
				return fiber::await(async_callable(func));
			}
			else if (func.type() == typeid(object_method)) {
				const auto &om = func.const_val<object_method>();
				return fiber::await(async_callable(om.callable, {om.object}));
			}
			return null_pointer;
		}